

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O0

void vkt::texture::anon_unknown_0::getBasicTexCoord3D
               (vector<float,_std::allocator<float>_> *dst,int cellNdx)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  reference pvVar7;
  float rBias;
  float rScale;
  float tBias;
  float tScale;
  float sBias;
  float sScale;
  int cellNdx_local;
  vector<float,_std::allocator<float>_> *dst_local;
  
  fVar1 = getBasicTexCoord3D::s_params[cellNdx % 0x10].sScale;
  fVar2 = getBasicTexCoord3D::s_params[cellNdx % 0x10].sBias;
  fVar3 = getBasicTexCoord3D::s_params[cellNdx % 0x10].tScale;
  fVar4 = getBasicTexCoord3D::s_params[cellNdx % 0x10].tBias;
  fVar5 = getBasicTexCoord3D::s_params[cellNdx % 0x10].rScale;
  fVar6 = getBasicTexCoord3D::s_params[cellNdx % 0x10].rBias;
  std::vector<float,_std::allocator<float>_>::resize(dst,0xc);
  pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](dst,0);
  *pvVar7 = fVar2;
  pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](dst,1);
  *pvVar7 = fVar4;
  pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](dst,2);
  *pvVar7 = fVar6;
  pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](dst,3);
  *pvVar7 = fVar2;
  pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](dst,4);
  *pvVar7 = fVar4 + fVar3;
  pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](dst,5);
  *pvVar7 = fVar5 * 0.5 + fVar6;
  pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](dst,6);
  *pvVar7 = fVar2 + fVar1;
  pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](dst,7);
  *pvVar7 = fVar4;
  pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](dst,8);
  *pvVar7 = fVar5 * 0.5 + fVar6;
  pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](dst,9);
  *pvVar7 = fVar2 + fVar1;
  pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](dst,10);
  *pvVar7 = fVar4 + fVar3;
  pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](dst,0xb);
  *pvVar7 = fVar6 + fVar5;
  return;
}

Assistant:

static void getBasicTexCoord3D (std::vector<float>& dst, int cellNdx)
{
	static const struct
	{
		const float sScale;
		const float sBias;
		const float tScale;
		const float tBias;
		const float rScale;
		const float rBias;
	} s_params[] =
	{
	//		sScale	sBias	tScale	tBias	rScale	rBias
		{	 0.9f,	-0.1f,	 0.7f,	 0.3f,	 0.8f,	 0.9f	},
		{	 1.2f,	-0.1f,	 1.1f,	 0.3f,	 1.0f,	 0.9f	},
		{	 1.5f,	 0.7f,	 0.9f,	-0.3f,	 1.1f,	 0.1f	},
		{	 1.2f,	 0.7f,	-2.3f,	-0.3f,	 1.1f,	 0.2f	},
		{	 1.1f,	 0.8f,	-1.3f,	-0.3f,	 2.9f,	 0.9f	},
		{	 3.4f,	 0.8f,	 4.0f,	 0.0f,	-3.3f,	-1.0f	},
		{	-3.4f,	-0.1f,	-4.0f,	 0.0f,	-5.1f,	 1.0f	},
		{	-4.0f,	-0.1f,	 3.4f,	 0.1f,	 5.7f,	 0.0f	},
		{	-5.6f,	 0.0f,	 0.5f,	 1.2f,	 3.9f,	 4.0f	},
		{	 5.0f,	-2.0f,	 3.1f,	 1.2f,	 5.1f,	 0.2f	},
		{	 2.5f,	-2.0f,	 6.3f,	 3.0f,	 5.1f,	 0.2f	},
		{	-8.3f,	 0.0f,	 7.1f,	 3.0f,	 2.0f,	 0.2f	},
		{	 3.8f,	 0.0f,	 9.7f,	 1.0f,	 7.0f,	 0.7f	},
		{	13.3f,	 0.0f,	 7.1f,	 3.0f,	 2.0f,	 0.2f	},
		{	16.0f,	 8.0f,	12.7f,	 1.0f,	17.1f,	 0.7f	},
		{	15.3f,	 0.0f,	20.1f,	 3.0f,	33.0f,	 3.2f	}
	};

	const float sScale	= s_params[cellNdx%DE_LENGTH_OF_ARRAY(s_params)].sScale;
	const float sBias	= s_params[cellNdx%DE_LENGTH_OF_ARRAY(s_params)].sBias;
	const float tScale	= s_params[cellNdx%DE_LENGTH_OF_ARRAY(s_params)].tScale;
	const float tBias	= s_params[cellNdx%DE_LENGTH_OF_ARRAY(s_params)].tBias;
	const float rScale	= s_params[cellNdx%DE_LENGTH_OF_ARRAY(s_params)].rScale;
	const float rBias	= s_params[cellNdx%DE_LENGTH_OF_ARRAY(s_params)].rBias;

	dst.resize(3*4);

	dst[0] = sBias;			dst[ 1] = tBias;			dst[ 2] = rBias;
	dst[3] = sBias;			dst[ 4] = tBias+tScale;		dst[ 5] = rBias+rScale*0.5f;
	dst[6] = sBias+sScale;	dst[ 7] = tBias;			dst[ 8] = rBias+rScale*0.5f;
	dst[9] = sBias+sScale;	dst[10] = tBias+tScale;		dst[11] = rBias+rScale;
}